

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.h
# Opt level: O2

void __thiscall Room::resizeAccess(Room *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->specialAccessedUsers_count;
  uVar6 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = (long)(int)(uVar1 * 2) << 2;
  }
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  puVar3 = (uint *)operator_new__(uVar4);
  puVar2 = this->specialAccessedUsers;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    puVar3[uVar6] = puVar2[uVar6];
  }
  this->specialAccessedUsers_count = uVar1 * 2;
  this->specialAccessedUsers = puVar3;
  return;
}

Assistant:

void resizeAccess(){
        unsigned int* newSpecialAccessedUsers = new unsigned int[specialAccessedUsers_count*2];
        for(int i=0;i<specialAccessedUsers_count;i++){
            newSpecialAccessedUsers[i] = specialAccessedUsers[i];
        }
        specialAccessedUsers_count<<=1;
        specialAccessedUsers = newSpecialAccessedUsers;
    }